

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int pagerWalFrames(Pager *pPager,PgHdr *pList,Pgno nTruncate,int isCommit)

{
  byte bVar1;
  i64 iVar2;
  Wal *pWal;
  u32 *puVar3;
  Pager *pPVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  u32 uVar8;
  u32 iPage;
  u32 nTruncate_00;
  long lVar9;
  u8 *p;
  PgHdr **ppPVar10;
  sqlite3_int64 sVar11;
  Pgno nTruncate_01;
  int iVar12;
  long lVar13;
  PgHdr *pPVar14;
  PgHdr *pPVar15;
  long lVar16;
  long lVar17;
  long in_FS_OFFSET;
  ulong local_d8;
  PgHdr *local_c8;
  long local_b0;
  PgHdr *pList_local;
  sqlite3_file *local_a0;
  u8 *local_98;
  u8 *local_90;
  Pager *local_88;
  WalWriter w;
  u32 aCksum [2];
  u32 salt1;
  undefined1 local_50;
  undefined1 local_4f;
  undefined1 local_4e;
  undefined1 local_4d;
  uint local_4c;
  undefined8 local_48;
  uint local_40;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pList_local = pList;
  if (isCommit == 0) {
    iVar5 = 1;
  }
  else {
    ppPVar10 = &pList_local;
    iVar5 = 0;
    for (; *ppPVar10 = pList, pList != (PgHdr *)0x0; pList = pList->pDirty) {
      if (pList->pgno <= nTruncate) {
        ppPVar10 = &pList->pDirty;
      }
      iVar5 = iVar5 + (uint)(pList->pgno <= nTruncate);
    }
  }
  pPVar14 = pList_local;
  pPager->aStat[2] = pPager->aStat[2] + iVar5;
  if (pList_local->pgno == 1) {
    pager_write_changecounter(pList_local);
  }
  iVar2 = pPager->pageSize;
  pWal = pPager->pWal;
  bVar1 = pPager->walSyncFlags;
  puVar3 = *pWal->apWiData;
  iVar5 = bcmp(&pWal->hdr,puVar3,0x30);
  if (iVar5 == 0) {
    uVar6 = 0;
  }
  else {
    uVar6 = puVar3[4] + 1;
  }
  uVar8 = (u32)iVar2;
  local_88 = pPager;
  if (pWal->readLock == 0) {
    if (puVar3[0x18] == 0) {
LAB_00127b1e:
      walUnlockShared(pWal,3);
      pWal->readLock = -1;
      iVar12 = 1;
      do {
        iVar5 = walTryBeginRead(pWal,(int *)&salt1,1,iVar12);
        iVar12 = iVar12 + 1;
      } while (iVar5 == -1);
    }
    else {
      sqlite3_randomness(4,&salt1);
      iVar5 = walLockExclusive(pWal,4,4);
      if (iVar5 == 5) goto LAB_00127b1e;
      if (iVar5 == 0) {
        walRestartHdr(pWal,salt1);
        walUnlockExclusive(pWal,4,4);
        goto LAB_00127b1e;
      }
    }
    if (iVar5 != 0) goto LAB_00127c48;
  }
  local_d8 = (ulong)(pWal->hdr).mxFrame;
  if (local_d8 == 0) {
    _salt1 = 0x18e22d0082067f37;
    local_50 = (undefined1)((ulong)iVar2 >> 0x18);
    local_4f = (undefined1)((ulong)iVar2 >> 0x10);
    local_4e = (undefined1)((ulong)iVar2 >> 8);
    local_4d = (undefined1)iVar2;
    uVar7 = pWal->nCkpt;
    local_4c = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
    if (uVar7 == 0) {
      sqlite3_randomness(8,(pWal->hdr).aSalt);
    }
    local_48 = *(undefined8 *)(pWal->hdr).aSalt;
    walChecksumBytes(1,(u8 *)&salt1,0x18,(u32 *)0x0,aCksum);
    local_40 = aCksum[0] >> 0x18 | (aCksum[0] & 0xff0000) >> 8 | (aCksum[0] & 0xff00) << 8 |
               aCksum[0] << 0x18;
    local_3c = aCksum[1] >> 0x18 | (aCksum[1] & 0xff0000) >> 8 | (aCksum[1] & 0xff00) << 8 |
               aCksum[1] << 0x18;
    pWal->szPage = uVar8;
    (pWal->hdr).bigEndCksum = '\0';
    (pWal->hdr).aFrameCksum[0] = aCksum[0];
    (pWal->hdr).aFrameCksum[1] = aCksum[1];
    pWal->truncateOnCommit = '\x01';
    iVar5 = (*pWal->pWalFd->pMethods->xWrite)(pWal->pWalFd,&salt1,0x20,0);
    if ((iVar5 != 0) ||
       (((pWal->syncHeader != '\0' && ((bVar1 >> 2 & 3) != 0)) &&
        (iVar5 = (*pWal->pWalFd->pMethods->xSync)(pWal->pWalFd,bVar1 >> 2 & 3), iVar5 != 0))))
    goto LAB_00127c48;
  }
  local_a0 = pWal->pWalFd;
  w.iSyncPoint = 0;
  lVar9 = (long)(int)(uVar8 + 0x18);
  lVar17 = local_d8 * lVar9 + 0x20;
  local_c8 = (PgHdr *)0x0;
  w.pWal = pWal;
  w.pFd = local_a0;
  w.syncFlags = (uint)bVar1;
  w.szPage = uVar8;
  for (pPVar15 = pPVar14; uVar7 = (uint)local_d8, pPVar15 != (PgHdr *)0x0; pPVar15 = pPVar15->pDirty
      ) {
    if (uVar6 == 0) {
LAB_00127a40:
      if (isCommit == 0) {
        nTruncate_01 = 0;
      }
      else {
        nTruncate_01 = 0;
        if (pPVar15->pDirty == (PgHdr *)0x0) {
          nTruncate_01 = nTruncate;
        }
      }
LAB_00127a58:
      iVar5 = walWriteOneFrame(&w,pPVar15,nTruncate_01,lVar17);
      if (iVar5 != 0) goto LAB_00127c48;
      local_d8 = (ulong)(uVar7 + 1);
      lVar17 = lVar17 + lVar9;
      *(byte *)&pPVar15->flags = (byte)pPVar15->flags | 0x40;
      local_c8 = pPVar15;
    }
    else {
      if ((isCommit != 0) && (nTruncate_01 = nTruncate, pPVar15->pDirty == (PgHdr *)0x0))
      goto LAB_00127a58;
      _salt1 = _salt1 & 0xffffffff00000000;
      sqlite3WalFindFrame(pWal,pPVar15->pgno,&salt1);
      if (salt1 < uVar6) goto LAB_00127a40;
      if (salt1 <= pWal->iReCksum - 1) {
        pWal->iReCksum = salt1;
      }
      iVar5 = (*pWal->pWalFd->pMethods->xWrite)
                        (pWal->pWalFd,pPVar15->pData,uVar8,(ulong)(salt1 - 1) * lVar9 + 0x38);
      if (iVar5 != 0) goto LAB_00127c48;
      *(byte *)&pPVar15->flags = (byte)pPVar15->flags & 0xbf;
    }
  }
  if (isCommit == 0) {
    iVar5 = 0;
    iVar12 = 0;
  }
  else {
    if (pWal->iReCksum != 0) {
      local_b0 = (long)(int)pWal->szPage + 0x18;
      iVar12 = (int)local_b0;
      p = (u8 *)sqlite3_malloc(iVar12);
      if (p == (u8 *)0x0) {
        iVar5 = 7;
        goto LAB_00127c48;
      }
      if (pWal->iReCksum == 1) {
        sVar11 = 0x18;
      }
      else {
        local_b0 = (long)iVar12;
        sVar11 = (ulong)(pWal->iReCksum - 2) * local_b0 + 0x30;
      }
      iVar5 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,p,8,sVar11);
      uVar8 = sqlite3Get4byte(p);
      (pWal->hdr).aFrameCksum[0] = uVar8;
      local_90 = p + 4;
      uVar8 = sqlite3Get4byte(local_90);
      (pWal->hdr).aFrameCksum[1] = uVar8;
      uVar8 = pWal->iReCksum;
      pWal->iReCksum = 0;
      local_98 = p + 0x18;
      for (; (iVar5 == 0 && (uVar8 <= uVar7)); uVar8 = uVar8 + 1) {
        lVar16 = (ulong)(uVar8 - 1) * local_b0 + 0x20;
        iVar5 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,p,iVar12,lVar16);
        if (iVar5 == 0) {
          iPage = sqlite3Get4byte(p);
          nTruncate_00 = sqlite3Get4byte(local_90);
          walEncodeFrame(pWal,iPage,nTruncate_00,local_98,(u8 *)&salt1);
          iVar5 = (*pWal->pWalFd->pMethods->xWrite)(pWal->pWalFd,&salt1,0x18,lVar16);
        }
      }
      sqlite3_free(p);
      if (iVar5 != 0) goto LAB_00127c48;
    }
    if ((bVar1 & 3) == 0) {
      iVar12 = 0;
LAB_00127e9c:
      iVar5 = 0;
    }
    else {
      if (pWal->padToSectorBoundary == '\0') {
        iVar12 = 0;
      }
      else {
        uVar6 = sqlite3SectorSize(pWal->pWalFd);
        lVar13 = lVar17 + (ulong)uVar6 + -1;
        lVar13 = lVar13 - lVar13 % (long)(ulong)uVar6;
        iVar12 = 0;
        w.iSyncPoint = lVar13;
        for (lVar16 = lVar17; lVar16 < lVar13; lVar16 = lVar16 + lVar9) {
          iVar5 = walWriteOneFrame(&w,local_c8,nTruncate,lVar16);
          if (iVar5 != 0) goto LAB_00127c48;
          iVar12 = iVar12 + 1;
        }
        if (lVar13 != lVar17) goto LAB_00127e9c;
      }
      iVar5 = (*local_a0->pMethods->xSync)(local_a0,bVar1 & 3);
    }
    if ((pWal->truncateOnCommit != '\0') && (lVar17 = pWal->mxWalSize, -1 < lVar17)) {
      lVar9 = lVar9 * (ulong)(uVar7 + iVar12) + 0x20;
      if (lVar9 <= lVar17) {
        lVar9 = lVar17;
      }
      walLimitSize(pWal,lVar9);
      pWal->truncateOnCommit = '\0';
    }
  }
  uVar8 = (pWal->hdr).mxFrame;
  pPVar15 = pPVar14;
  while ((pPVar15 != (PgHdr *)0x0 && (iVar5 == 0))) {
    iVar5 = 0;
    if ((pPVar15->flags & 0x40) != 0) {
      uVar8 = uVar8 + 1;
      iVar5 = walIndexAppend(pWal,uVar8,pPVar15->pgno);
    }
    pPVar15 = pPVar15->pDirty;
  }
  for (; (iVar5 == 0 && (0 < iVar12)); iVar12 = iVar12 + -1) {
    uVar8 = uVar8 + 1;
    iVar5 = walIndexAppend(pWal,uVar8,local_c8->pgno);
  }
  if (iVar5 == 0) {
    (pWal->hdr).szPage = (ushort)((ulong)iVar2 >> 0x10) | (ushort)iVar2 & 0xff00;
    (pWal->hdr).mxFrame = uVar8;
    if (isCommit != 0) {
      puVar3 = &(pWal->hdr).iChange;
      *puVar3 = *puVar3 + 1;
      (pWal->hdr).nPage = nTruncate;
      walIndexWriteHdr(pWal);
      pWal->iCallback = uVar8;
    }
    pPVar4 = local_88;
    iVar5 = 0;
    if (local_88->pBackup != (sqlite3_backup *)0x0) {
      for (; pPVar14 != (PgHdr *)0x0; pPVar14 = pPVar14->pDirty) {
        sqlite3BackupUpdate(pPVar4->pBackup,pPVar14->pgno,(u8 *)pPVar14->pData);
      }
    }
  }
LAB_00127c48:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar5;
}

Assistant:

static int pagerWalFrames(
  Pager *pPager,                  /* Pager object */
  PgHdr *pList,                   /* List of frames to log */
  Pgno nTruncate,                 /* Database size after this commit */
  int isCommit                    /* True if this is a commit */
){
  int rc;                         /* Return code */
  int nList;                      /* Number of pages in pList */
  PgHdr *p;                       /* For looping over pages */

  assert( pPager->pWal );
  assert( pList );
#ifdef SQLITE_DEBUG
  /* Verify that the page list is in accending order */
  for(p=pList; p && p->pDirty; p=p->pDirty){
    assert( p->pgno < p->pDirty->pgno );
  }
#endif

  assert( pList->pDirty==0 || isCommit );
  if( isCommit ){
    /* If a WAL transaction is being committed, there is no point in writing
    ** any pages with page numbers greater than nTruncate into the WAL file.
    ** They will never be read by any client. So remove them from the pDirty
    ** list here. */
    PgHdr **ppNext = &pList;
    nList = 0;
    for(p=pList; (*ppNext = p)!=0; p=p->pDirty){
      if( p->pgno<=nTruncate ){
        ppNext = &p->pDirty;
        nList++;
      }
    }
    assert( pList );
  }else{
    nList = 1;
  }
  pPager->aStat[PAGER_STAT_WRITE] += nList;

  if( pList->pgno==1 ) pager_write_changecounter(pList);
  rc = sqlite3WalFrames(pPager->pWal,
      pPager->pageSize, pList, nTruncate, isCommit, pPager->walSyncFlags
  );
  if( rc==SQLITE_OK && pPager->pBackup ){
    for(p=pList; p; p=p->pDirty){
      sqlite3BackupUpdate(pPager->pBackup, p->pgno, (u8 *)p->pData);
    }
  }

#ifdef SQLITE_CHECK_PAGES
  pList = sqlite3PcacheDirtyList(pPager->pPCache);
  for(p=pList; p; p=p->pDirty){
    pager_set_pagehash(p);
  }
#endif

  return rc;
}